

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_field.cc
# Opt level: O0

bool __thiscall Field::DoTraverse(Field *this,DataDepVisitor *visitor)

{
  bool bVar1;
  iterator this_00;
  __normal_iterator<Attr_**,_std::vector<Attr_*,_std::allocator<Attr_*>_>_> *in_RDI;
  iterator i;
  vector<Attr_*,_std::allocator<Attr_*>_> *in_stack_ffffffffffffffc8;
  DataDepElement *in_stack_ffffffffffffffd8;
  __normal_iterator<Attr_**,_std::vector<Attr_*,_std::allocator<Attr_*>_>_> local_20 [3];
  bool local_1;
  
  if ((in_RDI[0xd]._M_current == (Attr **)0x0) ||
     (bVar1 = DataDepElement::Traverse(in_stack_ffffffffffffffd8,(DataDepVisitor *)in_RDI), bVar1))
  {
    if (in_RDI[0x13]._M_current != (Attr **)0x0) {
      local_20[0]._M_current =
           (Attr **)std::vector<Attr_*,_std::allocator<Attr_*>_>::begin(in_stack_ffffffffffffffc8);
      while( true ) {
        this_00 = std::vector<Attr_*,_std::allocator<Attr_*>_>::end(in_stack_ffffffffffffffc8);
        bVar1 = __gnu_cxx::operator!=
                          (in_RDI,(__normal_iterator<Attr_**,_std::vector<Attr_*,_std::allocator<Attr_*>_>_>
                                   *)in_stack_ffffffffffffffc8);
        if (!bVar1) break;
        __gnu_cxx::__normal_iterator<Attr_**,_std::vector<Attr_*,_std::allocator<Attr_*>_>_>::
        operator*(local_20);
        bVar1 = DataDepElement::Traverse
                          ((DataDepElement *)this_00._M_current,(DataDepVisitor *)in_RDI);
        if (!bVar1) {
          return false;
        }
        __gnu_cxx::__normal_iterator<Attr_**,_std::vector<Attr_*,_std::allocator<Attr_*>_>_>::
        operator++(local_20);
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Field::DoTraverse(DataDepVisitor* visitor)
	{
	// Check parameterized type
	if ( type_ && ! type_->Traverse(visitor) )
		return false;
	foreach (i, AttrList, attrs_)
		if ( ! (*i)->Traverse(visitor) )
			return false;
	return true;
	}